

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

string * __thiscall
deqp::gls::DrawTestSpec::getMultilineDesc_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this)

{
  pointer pAVar1;
  string *psVar2;
  ostream *poVar3;
  InputType type;
  OutputType type_00;
  Storage storage;
  InputType type_01;
  OutputType type_02;
  IndexType type_03;
  Storage storage_00;
  IndexType type_04;
  Storage storage_01;
  IndexType type_05;
  Storage storage_02;
  IndexType type_06;
  Storage storage_03;
  IndexType type_07;
  Storage storage_04;
  IndexType type_08;
  Storage storage_05;
  IndexType type_09;
  Storage storage_06;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  long lStack_230;
  string local_220;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream desc;
  ostream local_1a8 [376];
  
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&desc);
  lVar4 = 0x25;
  for (uVar6 = 0; psVar2 = local_1e0,
      pAVar1 = (this->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->attribs).
                             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x28);
      uVar6 = uVar6 + 1) {
    if (*(char *)((long)pAVar1 + lVar4 + -1) == '\x01') {
      poVar3 = std::operator<<(local_1a8,"Attribute ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,": default, ");
      pcVar5 = "color\n";
      if ((*(byte *)((long)&pAVar1->inputType + lVar4) & 1) != 0) {
        pcVar5 = "position\n";
      }
      if (uVar6 == 0) {
        pcVar5 = "position\n";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"\tinput datatype ");
      inputTypeToString_abi_cxx11_
                (&local_200,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x25),type);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinput component count ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -0x15));
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tused as ");
      outputTypeToString_abi_cxx11_
                (&local_220,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x21),type_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      std::operator<<(poVar3,"\n");
    }
    else {
      poVar3 = std::operator<<(local_1a8,"Attribute ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,": ");
      pcVar5 = "color\n";
      if ((*(byte *)((long)&pAVar1->inputType + lVar4) & 1) != 0) {
        pcVar5 = "position\n";
      }
      if (uVar6 == 0) {
        pcVar5 = "position\n";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"\tStorage in ");
      storageToString_abi_cxx11_
                (&local_200,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x1d),storage);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tstride ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -0xd));
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinput datatype ");
      inputTypeToString_abi_cxx11_
                (&local_220,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x25),type_01);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinput component count ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -0x15));
      poVar3 = std::operator<<(poVar3,"\n");
      pcVar5 = gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1;
      if (*(char *)((long)pAVar1 + lVar4 + -9) != '\0') {
        pcVar5 = "\tnormalized\n";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"\tused as ");
      outputTypeToString_abi_cxx11_
                (&local_1d8,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x21),type_02);
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tinstance divisor ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -5));
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    lVar4 = lVar4 + 0x28;
  }
  lStack_230 = 0x28;
  switch(this->drawMethod) {
  case DRAWMETHOD_DRAWARRAYS:
    poVar3 = std::operator<<(local_1a8,"drawArrays()\n");
    poVar3 = std::operator<<(poVar3,"\tfirst ");
    lStack_230 = 0x1c;
    goto LAB_006da506;
  case DRAWMETHOD_DRAWARRAYS_INSTANCED:
    poVar3 = std::operator<<(local_1a8,"drawArraysInstanced()\n");
    poVar3 = std::operator<<(poVar3,"\tfirst ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    goto LAB_006da506;
  case DRAWMETHOD_DRAWARRAYS_INDIRECT:
    poVar3 = std::operator<<(local_1a8,"drawArraysIndirect()\n");
    poVar3 = std::operator<<(poVar3,"\tfirst ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindirect offset ");
    lStack_230 = 0x2c;
LAB_006da506:
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,*(int *)((long)&(this->apiType).m_bits + lStack_230));
    std::operator<<(poVar3,"\n");
    goto switchD_006d9fe7_default;
  case DRAWMETHOD_DRAWELEMENTS:
    poVar3 = std::operator<<(local_1a8,"drawElements()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_05);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_02);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::operator<<(poVar3,"\n");
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED:
    poVar3 = std::operator<<(local_1a8,"drawElementsRanged()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange start ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange end ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::operator<<(poVar3,"\n");
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED:
    poVar3 = std::operator<<(local_1a8,"drawElementsInstanced()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_07);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_04);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::operator<<(poVar3,"\n");
    break;
  case DRAWMETHOD_DRAWELEMENTS_INDIRECT:
    poVar3 = std::operator<<(local_1a8,"drawElementsIndirect()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_08);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_05);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindirect offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indirectOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,"\n");
    break;
  case DRAWMETHOD_DRAWELEMENTS_BASEVERTEX:
    poVar3 = std::operator<<(local_1a8,"drawElementsBaseVertex()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_06);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,"\n");
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX:
    poVar3 = std::operator<<(local_1a8,"drawElementsInstancedBaseVertex()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_09);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_06);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tinstance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,"\n");
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX:
    poVar3 = std::operator<<(local_1a8,"drawRangeElementsBaseVertex()\n");
    poVar3 = std::operator<<(poVar3,"\tindex type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_04);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tindex offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tbase vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange start ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\trange end ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::operator<<(poVar3,"\n");
    break;
  default:
    goto switchD_006d9fe7_default;
  }
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
switchD_006d9fe7_default:
  poVar3 = std::operator<<(local_1a8,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->primitiveCount);
  std::operator<<(poVar3," ");
  if ((ulong)this->primitive < 0xb) {
    std::operator<<(local_1a8,*(char **)(&DAT_00a30100 + (ulong)this->primitive * 8));
  }
  std::operator<<(local_1a8,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&desc);
  return psVar2;
}

Assistant:

std::string DrawTestSpec::getMultilineDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attrib.useDefaultAttribute)
		{
			desc
				<< "Attribute " << ndx << ": default, " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position\n") : ("color\n"))
				<< "\tinput datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "\n"
				<< "\tinput component count " << attrib.componentCount << "\n"
				<< "\tused as " << DrawTestSpec::outputTypeToString(attrib.outputType) << "\n";
		}
		else
		{
			desc
				<< "Attribute " << ndx << ": " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position\n") : ("color\n"))
				<< "\tStorage in " << DrawTestSpec::storageToString(attrib.storage) << "\n"
				<< "\tstride " << attrib.stride << "\n"
				<< "\tinput datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "\n"
				<< "\tinput component count " << attrib.componentCount << "\n"
				<< (attrib.normalize ? "\tnormalized\n" : "")
				<< "\tused as " << DrawTestSpec::outputTypeToString(attrib.outputType) << "\n"
				<< "\tinstance divisor " << attrib.instanceDivisor << "\n";
		}
	}

	if (drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		desc
			<< "drawArrays()\n"
			<< "\tfirst " << first << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		desc
			<< "drawArraysInstanced()\n"
			<< "\tfirst " << first << "\n"
			<< "\tinstance count " << instanceCount << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		desc
			<< "drawElements()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		desc
			<< "drawElementsRanged()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\trange start " << indexMin << "\n"
			<< "\trange end " << indexMax << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		desc
			<< "drawElementsInstanced()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		desc
			<< "drawArraysIndirect()\n"
			<< "\tfirst " << first << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tindirect offset " << indirectOffset << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		desc
			<< "drawElementsIndirect()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tindirect offset " << indirectOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
	{
		desc
			<< "drawElementsBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX)
	{
		desc
			<< "drawElementsInstancedBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
	{
		desc
			<< "drawRangeElementsBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n"
			<< "\trange start " << indexMin << "\n"
			<< "\trange end " << indexMax << "\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	desc << "\t" << primitiveCount << " ";

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			desc << "points";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			desc << "triangles";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			desc << "triangles (fan)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			desc << "triangles (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			desc << "lines";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			desc << "lines (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			desc << "lines (loop)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			desc << "lines (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			desc << "lines (strip, adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			desc << "triangles (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			desc << "triangles (strip, adjancency)";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	desc << "\n";

	return desc.str();
}